

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionFlowElementType::~IfcDistributionFlowElementType
          (IfcDistributionFlowElementType *this)

{
  ~IfcDistributionFlowElementType
            ((IfcDistributionFlowElementType *)
             &this[-1].super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
              super_IfcTypeObject.field_0x38);
  return;
}

Assistant:

IfcDistributionFlowElementType() : Object("IfcDistributionFlowElementType") {}